

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackLog.cxx
# Opt level: O1

void __thiscall cmCPackLog::~cmCPackLog(cmCPackLog *this)

{
  ~cmCPackLog(this);
  operator_delete(this,0x110);
  return;
}

Assistant:

cmCPackLog::~cmCPackLog()
{
  this->SetLogOutputStream(0);
}